

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O3

void __thiscall solitaire::graphics::Renderer::renderCardsInHand(Renderer *this)

{
  Card *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  int extraout_var_00;
  Card *card;
  Card *card_00;
  Position cardPosition;
  Position local_28;
  
  iVar2 = (*this->context->_vptr_Context[5])();
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x80))
                             ((long *)CONCAT44(extraout_var,iVar2));
  if (*plVar3 != plVar3[1]) {
    local_28.x = (*this->context->_vptr_Context[0x11])();
    pCVar1 = (Card *)plVar3[1];
    local_28.y = extraout_var_00;
    for (card_00 = (Card *)*plVar3; card_00 != pCVar1; card_00 = card_00 + 1) {
      renderCard(this,&local_28,card_00);
      local_28.y = local_28.y + 0x10;
    }
  }
  return;
}

Assistant:

void Renderer::renderCardsInHand() const {
    const auto& cards = context.getSolitaire().getCardsInHand();
    if (not cards.empty()) {
        auto cardPosition = context.getCardsInHandPosition();
        for (const auto& card: cards) {
            renderCard(cardPosition, card);
            cardPosition.y += Layout::uncoveredTableauPileCardsSpacing;
        }
    }
}